

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

void ERR_add_error_data(int num,...)

{
  char in_AL;
  ulong uVar1;
  void **ppvVar2;
  size_t sVar3;
  char *data;
  void **ppvVar4;
  size_t sVar5;
  uint uVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  void **local_120;
  uint local_108;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e8[1] = (void *)in_RSI;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_120 = &args[0].overflow_arg_area;
  uVar6 = 8;
  uVar9 = (ulong)(uint)num;
  local_108 = 8;
  uVar7 = 0;
  ppvVar4 = local_120;
  uVar8 = uVar9;
  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
    if (local_108 < 0x29) {
      uVar1 = (ulong)local_108;
      local_108 = local_108 + 8;
      ppvVar2 = (void **)((long)local_e8 + uVar1);
    }
    else {
      ppvVar2 = ppvVar4;
      ppvVar4 = ppvVar4 + 1;
    }
    if ((char *)*ppvVar2 != (char *)0x0) {
      sVar3 = strlen((char *)*ppvVar2);
      bVar10 = CARRY8(uVar7,sVar3);
      uVar7 = uVar7 + sVar3;
      if (bVar10) {
        return;
      }
    }
  }
  if (uVar7 == 0xffffffffffffffff) {
    return;
  }
  data = (char *)malloc(uVar7 + 1);
  if (data == (char *)0x0) {
    return;
  }
  *data = '\0';
  do {
    bVar10 = uVar9 == 0;
    uVar9 = uVar9 - 1;
    if (bVar10) {
      err_set_error_data(data);
      return;
    }
    uVar8 = (ulong)uVar6;
    if (uVar8 < 0x29) {
      uVar6 = uVar6 + 8;
      ppvVar4 = (void **)((long)local_e8 + uVar8);
    }
    else {
      ppvVar4 = local_120;
      local_120 = local_120 + 1;
    }
  } while (((char *)*ppvVar4 == (char *)0x0) ||
          (sVar5 = OPENSSL_strlcat(data,(char *)*ppvVar4,uVar7 + 1), sVar5 <= uVar7));
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                ,0x288,"void err_add_error_vdata(unsigned int, __va_list_tag *)");
}

Assistant:

void ERR_add_error_data(unsigned count, ...) {
  va_list args;
  va_start(args, count);
  err_add_error_vdata(count, args);
  va_end(args);
}